

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

unique_ptr<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>_>
wallet::MakeBerkeleyRODatabase
          (path *path,DatabaseOptions *options,DatabaseStatus *status,bilingual_str *error)

{
  long lVar1;
  undefined4 *in_RCX;
  __uniq_ptr_data<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>,_true,_true>
  in_RDI;
  long in_FS_OFFSET;
  runtime_error *e;
  unique_ptr<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>_> *db;
  path data_file;
  path *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  path *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BDBDataFile(in_stack_ffffffffffffff98);
  std::make_unique<wallet::BerkeleyRODatabase,fs::path&>
            ((path *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  *in_RCX = 0;
  fs::path::~path(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>,_true,_true>
          )(tuple<wallet::BerkeleyRODatabase_*,_std::default_delete<wallet::BerkeleyRODatabase>_>)
           in_RDI.
           super___uniq_ptr_impl<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::BerkeleyRODatabase_*,_std::default_delete<wallet::BerkeleyRODatabase>_>
           .super__Head_base<0UL,_wallet::BerkeleyRODatabase_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<BerkeleyRODatabase> MakeBerkeleyRODatabase(const fs::path& path, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error)
{
    fs::path data_file = BDBDataFile(path);
    try {
        std::unique_ptr<BerkeleyRODatabase> db = std::make_unique<BerkeleyRODatabase>(data_file);
        status = DatabaseStatus::SUCCESS;
        return db;
    } catch (const std::runtime_error& e) {
        error.original = e.what();
        status = DatabaseStatus::FAILED_LOAD;
        return nullptr;
    }
}